

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug-trace.cpp
# Opt level: O2

void __thiscall dynamicgraph::CustomEntity::testDebugTrace(CustomEntity *this)

{
  ostream *poVar1;
  
  if (*(int *)(_DAT_0010b2e0 + *(long *)(*(long *)_DAT_0010b2e0 + -0x18) + 0x20) == 0) {
    poVar1 = std::operator<<(_DAT_0010b2e0,
                             "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/debug-trace.cpp"
                            );
    poVar1 = std::operator<<(poVar1,": ");
    poVar1 = std::operator<<(poVar1,"testDebugTrace");
    poVar1 = std::operator<<(poVar1,"(#");
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,0x2d);
    poVar1 = std::operator<<(poVar1,") :");
    poVar1 = std::operator<<(poVar1,"# In {");
    std::endl<char,std::char_traits<char>>(poVar1);
    if (*(int *)(_DAT_0010b2e0 + *(long *)(*(long *)_DAT_0010b2e0 + -0x18) + 0x20) == 0) {
      poVar1 = std::operator<<(_DAT_0010b2e0,
                               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/debug-trace.cpp"
                              );
      poVar1 = std::operator<<(poVar1,": ");
      poVar1 = std::operator<<(poVar1,"testDebugTrace");
      poVar1 = std::operator<<(poVar1,"(#");
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,0x30);
      poVar1 = std::operator<<(poVar1,") :");
      poVar1 = std::operator<<(poVar1,"# In/Out { }");
      std::endl<char,std::char_traits<char>>(poVar1);
      if (*(int *)(_DAT_0010b2e0 + *(long *)(*(long *)_DAT_0010b2e0 + -0x18) + 0x20) == 0) {
        poVar1 = std::operator<<(_DAT_0010b2e0,
                                 "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/debug-trace.cpp"
                                );
        poVar1 = std::operator<<(poVar1,": ");
        poVar1 = std::operator<<(poVar1,"testDebugTrace");
        poVar1 = std::operator<<(poVar1,"(#");
        poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,0x32);
        poVar1 = std::operator<<(poVar1,") :");
        poVar1 = std::operator<<(poVar1,"Here is a test");
        std::endl<char,std::char_traits<char>>(poVar1);
        if (*(int *)(_DAT_0010b2e0 + *(long *)(*(long *)_DAT_0010b2e0 + -0x18) + 0x20) == 0) {
          poVar1 = std::operator<<(_DAT_0010b2e0,
                                   "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/debug-trace.cpp"
                                  );
          poVar1 = std::operator<<(poVar1,": ");
          poVar1 = std::operator<<(poVar1,"testDebugTrace");
          poVar1 = std::operator<<(poVar1,"(#");
          poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,0x35);
          poVar1 = std::operator<<(poVar1,") :");
          poVar1 = std::operator<<(poVar1,"# Out }");
          std::endl<char,std::char_traits<char>>(poVar1);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void testDebugTrace() {
    /// Test debugging information when entering the code.
    dgDEBUGIN(5);

    /// Intermediate test.
    dgDEBUGINOUT(5);

    dgDEBUG(5) << "Here is a test" << std::endl;

    /// Test debugging information when going out of the code.
    dgDEBUGOUT(5);
  }